

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O1

void verifyTinySVD_3x3<double>(Matrix33<double> *A)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int i;
  long lVar6;
  double *pdVar7;
  double (*padVar8) [3];
  int j;
  long lVar9;
  int iVar10;
  Matrix33 *pMVar11;
  int j_1;
  bool bVar12;
  double dVar13;
  double dVar14;
  Matrix33<double> S_times_Vt;
  Vec3<double> S;
  Matrix33<double> V;
  Matrix33<double> U;
  Matrix33<double> tmp;
  double local_1a8;
  double local_1a0;
  double dStack_198;
  double local_190;
  double local_188;
  double local_180;
  double dStack_178;
  double local_170;
  double local_168;
  Vec3 local_160 [16];
  double local_150;
  double local_148;
  double local_140;
  double dStack_138;
  double local_130;
  double local_128;
  double local_120;
  double dStack_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  undefined1 local_48 [16];
  double local_38;
  
  dVar13 = 0.0;
  lVar6 = 0;
  padVar8 = (double (*) [3])A;
  do {
    lVar9 = 0;
    dVar14 = dVar13;
    do {
      dVar13 = ABS((*(double (*) [3])*padVar8)[lVar9]);
      if (dVar13 <= dVar14) {
        dVar13 = dVar14;
      }
      lVar9 = lVar9 + 1;
      dVar14 = dVar13;
    } while (lVar9 != 3);
    lVar6 = lVar6 + 1;
    padVar8 = padVar8 + 1;
  } while (lVar6 != 3);
  local_a8 = dVar13 * 10.0 * 2.220446049250313e-16;
  uStack_a0 = 0;
  iVar10 = 0;
  while( true ) {
    local_100 = 1.0;
    local_e8 = 0.0;
    local_f8 = 0.0;
    dStack_f0 = 0.0;
    local_e0 = 1.0;
    local_c8 = 0.0;
    local_d8 = 0.0;
    dStack_d0 = 0.0;
    local_c0 = 1.0;
    local_148 = 1.0;
    local_130 = 0.0;
    local_140 = 0.0;
    dStack_138 = 0.0;
    local_128 = 1.0;
    local_110 = 0.0;
    local_120 = 0.0;
    dStack_118 = 0.0;
    local_108 = 1.0;
    Imath_3_2::jacobiSVD<double>
              ((Matrix33 *)A,(Matrix33 *)&local_100,local_160,(Matrix33 *)&local_148,
               2.220446049250313e-16,iVar10 == 0);
    local_1a8 = 1.0;
    local_190 = 0.0;
    local_1a0 = 0.0;
    dStack_198 = 0.0;
    local_188 = 1.0;
    local_170 = 0.0;
    local_180 = 0.0;
    dStack_178 = 0.0;
    local_168 = 1.0;
    pdVar7 = &local_1a8;
    lVar6 = 0;
    pMVar11 = (Matrix33 *)&local_148;
    do {
      lVar9 = 0;
      do {
        pdVar7[lVar9] = *(double *)(local_160 + lVar9 * 8) * *(double *)(pMVar11 + lVar9 * 8);
        dVar5 = local_170;
        dVar4 = dStack_178;
        dVar3 = local_180;
        dVar2 = local_190;
        dVar14 = dStack_198;
        dVar13 = local_1a0;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar6 = lVar6 + 1;
      pdVar7 = pdVar7 + 3;
      pMVar11 = pMVar11 + 0x18;
    } while (lVar6 != 3);
    local_1a0 = local_190;
    dStack_198 = dStack_178;
    local_190 = dVar13;
    local_180 = local_170;
    local_88 = local_170;
    uStack_80 = 0;
    dStack_178 = dVar14;
    local_170 = dVar3;
    local_b8 = local_100;
    uStack_b0 = 0;
    local_78 = dStack_f0 * dVar14 + local_100 * local_1a8 + local_f8 * dVar13;
    dStack_70 = dStack_f0 * dVar3 + local_100 * dVar2 + local_f8 * local_188;
    local_98 = local_f8;
    uStack_90 = 0;
    local_68 = local_168 * dStack_f0 + dVar4 * local_100 + local_f8 * dVar5;
    dStack_60 = dVar14 * local_d8 + local_1a8 * local_e8 + local_e0 * dVar13;
    local_58 = dVar3 * local_d8 + dVar2 * local_e8 + local_e0 * local_188;
    dStack_50 = local_168 * local_d8 + dVar4 * local_e8 + local_e0 * dVar5;
    dVar2 = local_c0 * dVar3 + dStack_d0 * dVar2 + local_c8 * local_188;
    local_48._8_4_ = SUB84(dVar2,0);
    local_48._0_8_ = local_c0 * dVar14 + dStack_d0 * local_1a8 + local_c8 * dVar13;
    local_48._12_4_ = (int)((ulong)dVar2 >> 0x20);
    local_38 = local_168 * local_c0 + dVar4 * dStack_d0 + dVar5 * local_c8;
    pdVar7 = &local_78;
    lVar6 = 0;
    padVar8 = (double (*) [3])A;
    do {
      lVar9 = 0;
      do {
        if (local_a8 < ABS(pdVar7[lVar9] - (*(double (*) [3])*padVar8)[lVar9])) {
          __assert_fail("std::abs (product[i][j] - A[i][j]) <= valueEps",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                        ,0x55,"void verifyTinySVD_3x3(const Imath_3_2::Matrix33<T> &) [T = double]")
          ;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar6 = lVar6 + 1;
      padVar8 = padVar8 + 1;
      pdVar7 = pdVar7 + 3;
    } while (lVar6 != 3);
    if (iVar10 == 0) {
      if (dStack_f0 * (local_e8 * local_c8 - dStack_d0 * local_e0) +
          local_100 * (local_e0 * local_c0 - local_c8 * local_d8) +
          local_f8 * (local_d8 * dStack_d0 - local_c0 * local_e8) <= 0.9) {
        __assert_fail("U.determinant () > 0.9",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x5a,"void verifyTinySVD_3x3(const Imath_3_2::Matrix33<T> &) [T = double]");
      }
      if ((local_130 * local_110 - dStack_118 * local_128) * dStack_138 +
          (local_128 * local_108 - local_110 * local_120) * local_148 +
          (local_120 * dStack_118 - local_108 * local_130) * local_140 <= 0.9) {
        __assert_fail("V.determinant () > 0.9",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x5b,"void verifyTinySVD_3x3(const Imath_3_2::Matrix33<T> &) [T = double]");
      }
    }
    lVar6 = 1;
    while (lVar6 != 3) {
      lVar9 = lVar6 * 8;
      lVar1 = lVar6 * 8;
      lVar6 = lVar6 + 1;
      if (*(double *)(local_160 + lVar9 + -8) < *(double *)(local_160 + lVar1)) {
        __assert_fail("S[i] >= S[i + 1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x60,"void verifyTinySVD_3x3(const Imath_3_2::Matrix33<T> &) [T = double]");
      }
    }
    lVar6 = 0;
    do {
      if (*(double *)(local_160 + lVar6 * 8) < 0.0) {
        __assert_fail("S[i] >= T (0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,100,"void verifyTinySVD_3x3(const Imath_3_2::Matrix33<T> &) [T = double]");
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    if ((iVar10 != 0) && (local_150 < 0.0)) break;
    verifyOrthonormal<double>((Matrix33<double> *)&local_100);
    verifyOrthonormal<double>((Matrix33<double> *)&local_148);
    bVar12 = iVar10 != 0;
    iVar10 = iVar10 + 1;
    if (bVar12) {
      return;
    }
  }
  __assert_fail("S[2] >= T (0)",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                ,0x66,"void verifyTinySVD_3x3(const Imath_3_2::Matrix33<T> &) [T = double]");
}

Assistant:

void
verifyTinySVD_3x3 (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A)
{
    T maxEntry = 0;
    for (int i = 0; i < 3; ++i)
        for (int j = 0; j < 3; ++j)
            maxEntry = std::max (maxEntry, std::abs (A[i][j]));

    const T eps      = std::numeric_limits<T>::epsilon ();
    const T valueEps = maxEntry * T (10) * eps;

    for (int i = 0; i < 2; ++i)
    {
        const bool posDet = (i == 0);

        IMATH_INTERNAL_NAMESPACE::Matrix33<T> U, V;
        IMATH_INTERNAL_NAMESPACE::Vec3<T>     S;
        IMATH_INTERNAL_NAMESPACE::jacobiSVD (A, U, S, V, eps, posDet);

        IMATH_INTERNAL_NAMESPACE::Matrix33<T> S_times_Vt;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                S_times_Vt[i][j] = S[j] * V[i][j];
        S_times_Vt.transpose ();

        // Verify that the product of the matrices is A:
        const IMATH_INTERNAL_NAMESPACE::Matrix33<T> product = U * S_times_Vt;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                assert (std::abs (product[i][j] - A[i][j]) <= valueEps);

        // Verify that U and V are orthogonal:
        if (posDet)
        {
            assert (U.determinant () > 0.9);
            assert (V.determinant () > 0.9);
        }

        // Verify that the singular values are sorted:
        for (int i = 0; i < 2; ++i)
            assert (S[i] >= S[i + 1]);

        // Verify that all the SVs except maybe the last one are positive:
        for (int i = 0; i < 2; ++i)
            assert (S[i] >= T (0));

        if (!posDet) assert (S[2] >= T (0));

        verifyOrthonormal (U);
        verifyOrthonormal (V);
    }
}